

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Http *pHVar1;
  int __n;
  Http *http;
  function<void_(MNS::SocketData_*)> *in_stack_ffffffffffffff58;
  Server *in_stack_ffffffffffffff60;
  Server *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff68;
  Server *this_00;
  Http *in_stack_ffffffffffffff78;
  anon_class_1_0_00000001 local_68 [88];
  Http *local_10;
  undefined4 local_4;
  
  local_4 = 0;
  signal(0xf,onSignalReceived);
  signal(2,onSignalReceived);
  signal(0xe,onSignalReceived);
  pHVar1 = (Http *)operator_new(8);
  MNS::Http::Http(pHVar1);
  local_10 = pHVar1;
  server = MNS::Http::createServer(in_stack_ffffffffffffff78);
  this_00 = server;
  std::function<void(MNS::SocketData*)>::function<main::__0,void>
            ((function<void_(MNS::SocketData_*)> *)server,in_stack_ffffffffffffff68);
  MNS::Server::onHttpConnection(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::function<void_(MNS::SocketData_*)>::~function((function<void_(MNS::SocketData_*)> *)0x11678e)
  ;
  this = server;
  std::function<void(MNS::SocketData*)>::function<main::__1,void>
            ((function<void_(MNS::SocketData_*)> *)this_00,local_68);
  MNS::Server::onHttpRequest(this,in_stack_ffffffffffffff58);
  std::function<void_(MNS::SocketData_*)>::~function((function<void_(MNS::SocketData_*)> *)0x1167c9)
  ;
  MNS::Server::listen(server,0x1f90,__n);
  MNS::Server::run((Server *)0x1167e6);
  if (local_10 != (Http *)0x0) {
    pHVar1 = local_10;
    MNS::Http::~Http((Http *)this);
    operator_delete(pHVar1);
  }
  return 0;
}

Assistant:

int main() {
	signal(SIGTERM, onSignalReceived);
	signal(SIGINT, onSignalReceived);
	signal(SIGALRM, onSignalReceived);

	MNS::Http *http = new MNS::Http();
	server = http->createServer();
	server->onHttpConnection([](MNS::SocketData *data) {
	});

	server->onHttpRequest([](MNS::SocketData *data) {
		MNS::Response *response = data->response;

		response->end("Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!", 120);
	});
	server->listen(8080);
	server->run();

	delete (http);
	return 0;
}